

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

void __thiscall
amrex::LineDistFcnElement2d::single_seg_cpdist
          (LineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real y0,Real y1,RealVect *cp,
          Real *dist)

{
  double dVar1;
  double dVar2;
  Real *pRVar3;
  double *in_RDX;
  Real *in_RSI;
  double in_XMM0_Qa;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  RealVect delta;
  Real t;
  Real magBsq;
  RealVect B;
  RealVect A;
  RealVect *p;
  RealVect *s;
  RealVect local_108 [2];
  RealVect local_d8;
  Real local_c0;
  Real local_b8;
  Real local_b0;
  RealVect local_a8;
  RealVect local_90;
  double local_78;
  double local_70;
  RealVect local_68;
  RealVect local_50;
  double *local_38;
  Real *local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_XMM3_Qa;
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  pRVar3 = RealVect::operator[]((RealVect *)&stack0x00000008,0);
  dVar4 = *pRVar3 - local_10;
  pRVar3 = RealVect::operator[]((RealVect *)&stack0x00000008,1);
  RealVect::RealVect(&local_50,dVar4,*pRVar3 - local_20,0.0);
  RealVect::RealVect(&local_68,local_18 - local_10,local_28 - local_20,0.0);
  pRVar3 = RealVect::operator[](&local_68,0);
  s = (RealVect *)*pRVar3;
  pRVar3 = RealVect::operator[](&local_68,0);
  dVar4 = *pRVar3;
  pRVar3 = RealVect::operator[](&local_68,1);
  p = (RealVect *)*pRVar3;
  pRVar3 = RealVect::operator[](&local_68,1);
  local_70 = (double)s * dVar4 + (double)p * *pRVar3;
  pRVar3 = RealVect::operator[](&local_50,0);
  dVar4 = *pRVar3;
  pRVar3 = RealVect::operator[](&local_68,0);
  dVar1 = *pRVar3;
  pRVar3 = RealVect::operator[](&local_50,1);
  dVar2 = *pRVar3;
  pRVar3 = RealVect::operator[](&local_68,1);
  local_78 = (dVar4 * dVar1 + dVar2 * *pRVar3) / local_70;
  if (0.0 <= local_78) {
    if (local_78 <= 1.0) {
      RealVect::RealVect(&local_d8,local_10,local_20,0.0);
      amrex::operator*((Real)s,p);
      amrex::operator+(s,p);
      *local_30 = local_c0;
      local_30[1] = local_b8;
      local_30[2] = local_b0;
    }
    else {
      RealVect::RealVect(&local_a8,local_18,local_28,0.0);
      *local_30 = local_a8.vect[0];
      local_30[1] = local_a8.vect[1];
      local_30[2] = local_a8.vect[2];
    }
  }
  else {
    RealVect::RealVect(&local_90,local_10,local_20,0.0);
    *local_30 = local_90.vect[0];
    local_30[1] = local_90.vect[1];
    local_30[2] = local_90.vect[2];
  }
  amrex::operator-(s,p);
  pRVar3 = RealVect::operator[](local_108,0);
  dVar4 = *pRVar3;
  pRVar3 = RealVect::operator[](local_108,0);
  dVar1 = *pRVar3;
  pRVar3 = RealVect::operator[](local_108,1);
  dVar2 = *pRVar3;
  pRVar3 = RealVect::operator[](local_108,1);
  dVar4 = sqrt(dVar4 * dVar1 + dVar2 * *pRVar3);
  *local_38 = dVar4;
  return;
}

Assistant:

void LineDistFcnElement2d::single_seg_cpdist(amrex::RealVect pt,
                                             amrex::Real x0, amrex::Real x1,
                                             amrex::Real y0, amrex::Real y1,
                                             amrex::RealVect& cp,
                                             amrex::Real& dist) const {
  amrex::RealVect A(AMREX_D_DECL(pt[0]-x0, pt[1]-y0,0.0));
  amrex::RealVect B(AMREX_D_DECL(x1-x0, y1-y0,0.0));

  amrex::Real magBsq = B[0]*B[0] + B[1]*B[1];
  amrex::Real t =  (A[0]*B[0] + A[1]*B[1])/magBsq;

  if (t < 0) {
    cp = amrex::RealVect(AMREX_D_DECL(x0,y0,0.0));
  } else if (t > 1.0) {
    cp = amrex::RealVect(AMREX_D_DECL(x1,y1,0.0));
  } else {
    cp  = amrex::RealVect(AMREX_D_DECL(x0,y0,0.0)) + t*B;
  }

  amrex::RealVect delta = pt - cp;
  dist = sqrt(delta[0]*delta[0] + delta[1]*delta[1] );

  return;
}